

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

iterator __thiscall
QMultiMap<QFontCache::Key,_QFontCache::Engine>::find
          (QMultiMap<QFontCache::Key,_QFontCache::Engine> *this,Key *key)

{
  QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  QMultiMap<QFontCache::Key,_QFontCache::Engine> copy;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>_*>
          )(QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
            *)0x0;
  }
  else {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_20.d.ptr !=
        (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
         *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                          *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QFontCache::Key,_std::pair<const_QFontCache::Key,_QFontCache::Engine>,_std::_Select1st<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)(iterator)iVar2._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator find(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.find(key));
    }